

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptInterpreter.cpp
# Opt level: O2

void __thiscall MiniScript::Interpreter::Interpreter(Interpreter *this,String *source)

{
  String local_20;
  
  this->_vptr_Interpreter = (_func_int **)&PTR_ReportError_00166648;
  this->parser = (Parser *)0x0;
  this->standardOutput = (TextOutputMethod)0x0;
  this->implicitOutput = (TextOutputMethod)0x0;
  this->errorOutput = (TextOutputMethod)0x0;
  this->hostData = (void *)0x0;
  this->vm = (Machine *)0x0;
  (this->source).ss = (StringStorage *)0x0;
  (this->source).isTemp = false;
  String::String(&local_20,source);
  Reset(this,&local_20);
  String::~String(&local_20);
  return;
}

Assistant:

Interpreter::Interpreter(String source) : standardOutput(nullptr), errorOutput(nullptr), implicitOutput(nullptr),
	parser(nullptr), vm(nullptr), hostData(nullptr) {
		Reset(source);
	}